

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O1

sexp_conflict
sexp_make_tm_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                 sexp_conflict arg1,sexp_conflict arg2,sexp_conflict arg3,sexp_conflict arg4,
                 sexp_conflict arg5,sexp_conflict arg6)

{
  sexp_conflict psVar1;
  int *piVar2;
  int iVar3;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  
  local_48.var = &local_50;
  local_50 = (sexp_conflict)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x20,(long)(self->value).type.setters >> 1);
  local_50 = psVar1;
  piVar2 = (int *)calloc(1,0x38);
  (psVar1->value).cpointer.value = piVar2;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[6] = 0;
  piVar2[7] = 0;
  piVar2[8] = 0;
  piVar2[9] = 0;
  piVar2[10] = 0;
  piVar2[0xb] = 0;
  piVar2[0xc] = 0;
  piVar2[0xd] = 0;
  psVar1->field_0x5 = psVar1->field_0x5 | 2;
  if (((ulong)arg0 & 1) == 0) {
    if ((((ulong)arg0 & 2) == 0) && (arg0->tag == 0xc)) {
      iVar3 = (int)(arg0->value).flonum_bits[0] * (int)(arg0->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg0 >> 1);
  }
  *piVar2 = iVar3;
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      iVar3 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg1 >> 1);
  }
  piVar2[1] = iVar3;
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
      iVar3 = (int)(arg2->value).flonum_bits[0] * (int)(arg2->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg2 >> 1);
  }
  piVar2[2] = iVar3;
  if (((ulong)arg3 & 1) == 0) {
    if ((((ulong)arg3 & 2) == 0) && (arg3->tag == 0xc)) {
      iVar3 = (int)(arg3->value).flonum_bits[0] * (int)(arg3->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg3 >> 1);
  }
  piVar2[3] = iVar3;
  if (((ulong)arg4 & 1) == 0) {
    if ((((ulong)arg4 & 2) == 0) && (arg4->tag == 0xc)) {
      iVar3 = (int)(arg4->value).flonum_bits[0] * (int)(arg4->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg4 >> 1);
  }
  piVar2[4] = iVar3;
  if (((ulong)arg5 & 1) == 0) {
    if ((((ulong)arg5 & 2) == 0) && (arg5->tag == 0xc)) {
      iVar3 = (int)(arg5->value).flonum_bits[0] * (int)(arg5->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg5 >> 1);
  }
  piVar2[5] = iVar3;
  if (((ulong)arg6 & 1) == 0) {
    if ((((ulong)arg6 & 2) == 0) && (arg6->tag == 0xc)) {
      iVar3 = (int)(arg6->value).flonum_bits[0] * (int)(arg6->value).uvector.length;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = (int)((long)arg6 >> 1);
  }
  piVar2[8] = iVar3;
  (ctx->value).context.saves = local_48.next;
  return local_50;
}

Assistant:

sexp sexp_make_tm_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3, sexp arg4, sexp arg5, sexp arg6) {
  struct tm* r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_tagged(ctx, sexp_sizeof(cpointer), sexp_unbox_fixnum(sexp_opcode_return_type(self)));
  sexp_cpointer_value(res) = calloc(1, sizeof(struct tm));
  r = (struct tm*) sexp_cpointer_value(res);
  memset(r, 0, sizeof(struct tm));
  sexp_freep(res) = 1;
  r->tm_sec = sexp_sint_value(arg0);
  r->tm_min = sexp_sint_value(arg1);
  r->tm_hour = sexp_sint_value(arg2);
  r->tm_mday = sexp_sint_value(arg3);
  r->tm_mon = sexp_sint_value(arg4);
  r->tm_year = sexp_sint_value(arg5);
  r->tm_isdst = sexp_sint_value(arg6);
  sexp_gc_release1(ctx);
  return res;
}